

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.hpp
# Opt level: O3

void __thiscall diy::Master::InFlightRecv::reset(InFlightRecv *this)

{
  MemoryManagement *__x;
  Deallocate *__x_00;
  MemCopy *__x_01;
  MemoryManagement mem_;
  _Any_data local_150;
  code *local_140;
  _Any_data local_130;
  code *local_120;
  _Any_data local_110;
  code *local_100;
  MemoryBuffer local_f0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  __x = &this->mem;
  std::function<char_*(int,_unsigned_long)>::function
            ((function<char_*(int,_unsigned_long)> *)&local_150,&__x->allocate);
  __x_00 = &(this->mem).deallocate;
  std::function<void_(const_char_*)>::function((function<void_(const_char_*)> *)&local_130,__x_00);
  __x_01 = &(this->mem).copy;
  std::function<void_(char_*,_const_char_*,_unsigned_long)>::function
            ((function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_110,__x_01);
  uStack_94 = 0;
  local_f0.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_0014e418;
  local_f0.position = 0;
  local_f0.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f0.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f0.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f0.blob_position = 0;
  local_f0.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = 0xffffffff;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  uStack_98 = 0xffffffff;
  local_90._M_unused._M_object = (void *)0x0;
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
             ::_M_manager;
  local_70._M_unused._M_object = (void *)0x0;
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
             ::_M_manager;
  local_50._M_unused._M_object = (void *)0x0;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
             ::_M_manager;
  MemoryBuffer::operator=(&this->message,&local_f0);
  (this->info).from = local_a8;
  (this->info).to = uStack_a4;
  (this->info).nparts = uStack_a0;
  (this->info).round = uStack_9c;
  *(ulong *)((long)&(this->info).round + 1) =
       CONCAT17((undefined1)uStack_94,CONCAT43(uStack_98,uStack_9c._1_3_));
  std::function<char_*(int,_unsigned_long)>::operator=
            (&__x->allocate,(function<char_*(int,_unsigned_long)> *)&local_90);
  std::function<void_(const_char_*)>::operator=(__x_00,(function<void_(const_char_*)> *)&local_70);
  std::function<void_(char_*,_const_char_*,_unsigned_long)>::operator=
            (__x_01,(function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  local_f0.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_0014e418;
  std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::~vector(&local_f0.blobs);
  if (local_f0.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::function<char_*(int,_unsigned_long)>::operator=
            (&__x->allocate,(function<char_*(int,_unsigned_long)> *)&local_150);
  std::function<void_(const_char_*)>::operator=(__x_00,(function<void_(const_char_*)> *)&local_130);
  std::function<void_(char_*,_const_char_*,_unsigned_long)>::operator=
            (__x_01,(function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_110);
  if (local_100 != (code *)0x0) {
    (*local_100)(&local_110,&local_110,__destroy_functor);
  }
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,__destroy_functor);
  }
  if (local_140 != (code *)0x0) {
    (*local_140)(&local_150,&local_150,__destroy_functor);
  }
  return;
}

Assistant:

void            reset()
        {
            MemoryManagement mem_ = mem;
            *this = InFlightRecv();
            mem = mem_;
        }